

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::ChooseConfigCase::fillDontCare
          (ChooseConfigCase *this,
          vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
          *attributes)

{
  uint uVar1;
  pointer ppVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  int ndx;
  long lVar7;
  bool bVar8;
  pair<unsigned_int,_int> local_30;
  
  lVar7 = 0;
  do {
    ppVar2 = (attributes->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(attributes->
                  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
    if (lVar4 == 0) {
      uVar1 = fillDontCare::dontCareAttributes[lVar7];
LAB_00223bdb:
      local_30 = (pair<unsigned_int,_int>)((ulong)uVar1 | 0xffffffff00000000);
      std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
      emplace_back<std::pair<unsigned_int,int>>
                ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
                 attributes,&local_30);
    }
    else {
      lVar4 = lVar4 >> 3;
      uVar1 = fillDontCare::dontCareAttributes[lVar7];
      lVar5 = 0;
      bVar3 = false;
      do {
        bVar6 = bVar3;
        bVar8 = ppVar2[lVar5].first == uVar1;
        lVar5 = lVar5 + 1;
        bVar3 = (bool)(bVar6 | bVar8);
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
      if (!bVar6 && !bVar8) goto LAB_00223bdb;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void fillDontCare (std::vector<std::pair<EGLenum, EGLint> >& attributes)
	{
		static const EGLenum dontCareAttributes[] =
		{
			EGL_TRANSPARENT_TYPE,
			EGL_COLOR_BUFFER_TYPE,
			EGL_RENDERABLE_TYPE,
			EGL_SURFACE_TYPE
		};

		// Fill appropriate unused attributes with EGL_DONT_CARE
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(dontCareAttributes); ndx++)
		{
			bool found = false;
			for (size_t findNdx = 0; findNdx < attributes.size(); findNdx++)
				if (attributes[findNdx].first == dontCareAttributes[ndx]) found = true;

			if (!found) attributes.push_back(std::make_pair(dontCareAttributes[ndx], EGL_DONT_CARE));
		}
	}